

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArray.h
# Opt level: O0

void __thiscall
COLLADAFW::Array<COLLADABU::Math::Matrix4>::allocMemory
          (Array<COLLADABU::Math::Matrix4> *this,size_t count,int flags)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Matrix4 *data;
  uint in_EDX;
  ulong in_RSI;
  Array<COLLADABU::Math::Matrix4> *in_RDI;
  Matrix4 *local_50;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI;
  uVar2 = SUB168(auVar1 * ZEXT816(0x88),0);
  if (SUB168(auVar1 * ZEXT816(0x88),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  data = (Matrix4 *)operator_new__(uVar2);
  if (in_RSI != 0) {
    local_50 = data;
    do {
      COLLADABU::Math::Matrix4::Matrix4(local_50);
      local_50 = local_50 + 1;
    } while (local_50 != data + in_RSI);
  }
  setData(in_RDI,data,0,in_RSI);
  in_RDI->mFlags = in_EDX | in_RDI->mFlags;
  return;
}

Assistant:

void allocMemory ( size_t count, int flags = DEFAULT_ALLOC_FLAGS )
        {
            setData ( new Type[count], 0, count );
            mFlags |= flags;
        }